

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

void secp256k1_nonce_function_musig_sha256_tagged_aux(secp256k1_sha256 *sha)

{
  secp256k1_sha256 *in_RDI;
  
  secp256k1_sha256_initialize(in_RDI);
  in_RDI->s[0] = 0xa19e884b;
  in_RDI->s[1] = 0xf463fe7e;
  in_RDI->s[2] = 0x2f18f9a2;
  in_RDI->s[3] = 0xbeb0f9ff;
  in_RDI->s[4] = 0xf37e8b0;
  in_RDI->s[5] = 0x6ebd26f;
  in_RDI->s[6] = 0xe3b243d2;
  in_RDI->s[7] = 0x522fb150;
  in_RDI->bytes = 0x40;
  return;
}

Assistant:

static void secp256k1_nonce_function_musig_sha256_tagged_aux(secp256k1_sha256 *sha) {
    secp256k1_sha256_initialize(sha);
    sha->s[0] = 0xa19e884bul;
    sha->s[1] = 0xf463fe7eul;
    sha->s[2] = 0x2f18f9a2ul;
    sha->s[3] = 0xbeb0f9fful;
    sha->s[4] = 0x0f37e8b0ul;
    sha->s[5] = 0x06ebd26ful;
    sha->s[6] = 0xe3b243d2ul;
    sha->s[7] = 0x522fb150ul;
    sha->bytes = 64;
}